

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O3

void __thiscall tf::TaskQueue<tf::Node_*>::TaskQueue(TaskQueue<tf::Node_*> *this,int64_t c)

{
  ulong uVar1;
  __pointer_type pAVar2;
  atomic<tf::Node_*> *__s;
  
  (this->_top).super___atomic_base<long>._M_i = 0;
  uVar1 = c - 1;
  (this->_bottom).super___atomic_base<long>._M_i = 0;
  (this->_array)._M_b._M_p = (__pointer_type)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar1 < (c ^ uVar1)) {
    (this->_top).super___atomic_base<long>._M_i = 0;
    (this->_bottom).super___atomic_base<long>._M_i = 0;
    pAVar2 = (__pointer_type)operator_new(0x18);
    pAVar2->C = c;
    pAVar2->M = uVar1;
    __s = (atomic<tf::Node_*> *)operator_new__(-(ulong)((ulong)c >> 0x3d != 0) | c << 3);
    memset(__s,0,c << 3);
    pAVar2->S = __s;
    (this->_array)._M_b._M_p = pAVar2;
    std::
    vector<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
    ::reserve(&this->_garbage,0x20);
    return;
  }
  __assert_fail("c && (!(c & (c-1)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/tsq.hpp"
                ,0x8c,"tf::TaskQueue<tf::Node *>::TaskQueue(int64_t) [T = tf::Node *]");
}

Assistant:

TaskQueue<T>::TaskQueue(int64_t c) {
  assert(c && (!(c & (c-1))));
  _top.store(0, std::memory_order_relaxed);
  _bottom.store(0, std::memory_order_relaxed);
  _array.store(new Array{c}, std::memory_order_relaxed);
  _garbage.reserve(32);
}